

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btVector3.h
# Opt level: O3

btVector3 btSoftBody::clusterVelocity(Cluster *cluster,btVector3 *rpos)

{
  float fVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  btVector3 bVar8;
  
  fVar1 = (cluster->m_av).m_floats[2];
  fVar4 = (float)*(undefined8 *)rpos->m_floats;
  fVar5 = (float)((ulong)*(undefined8 *)rpos->m_floats >> 0x20);
  uVar2 = *(undefined8 *)((cluster->m_lv).m_floats + 1);
  uVar3 = *(undefined8 *)(cluster->m_av).m_floats;
  fVar6 = (float)uVar3;
  fVar7 = (float)((ulong)uVar3 >> 0x20);
  bVar8.m_floats[0] = (fVar7 * rpos->m_floats[2] - fVar5 * fVar1) + (cluster->m_lv).m_floats[0];
  bVar8.m_floats[1] = (fVar1 * fVar4 - rpos->m_floats[2] * fVar6) + (float)uVar2;
  bVar8.m_floats[2] = (fVar6 * fVar5 - fVar4 * fVar7) + (float)((ulong)uVar2 >> 0x20);
  bVar8.m_floats[3] = 0.0;
  return (btVector3)bVar8.m_floats;
}

Assistant:

SIMD_FORCE_INLINE btVector3 cross(const btVector3& v) const
	{
#if defined(BT_USE_SSE_IN_API) && defined (BT_USE_SSE)
		__m128	T, V;

		T = bt_pshufd_ps(mVec128, BT_SHUFFLE(1, 2, 0, 3));	//	(Y Z X 0)
		V = bt_pshufd_ps(v.mVec128, BT_SHUFFLE(1, 2, 0, 3));	//	(Y Z X 0)

		V = _mm_mul_ps(V, mVec128);
		T = _mm_mul_ps(T, v.mVec128);
		V = _mm_sub_ps(V, T);

		V = bt_pshufd_ps(V, BT_SHUFFLE(1, 2, 0, 3));
		return btVector3(V);
#elif defined(BT_USE_NEON)
		float32x4_t T, V;
		// form (Y, Z, X, _) of mVec128 and v.mVec128
		float32x2_t Tlow = vget_low_f32(mVec128);
		float32x2_t Vlow = vget_low_f32(v.mVec128);
		T = vcombine_f32(vext_f32(Tlow, vget_high_f32(mVec128), 1), Tlow);
		V = vcombine_f32(vext_f32(Vlow, vget_high_f32(v.mVec128), 1), Vlow);

		V = vmulq_f32(V, mVec128);
		T = vmulq_f32(T, v.mVec128);
		V = vsubq_f32(V, T);
		Vlow = vget_low_f32(V);
		// form (Y, Z, X, _);
		V = vcombine_f32(vext_f32(Vlow, vget_high_f32(V), 1), Vlow);
		V = (float32x4_t)vandq_s32((int32x4_t)V, btvFFF0Mask);

		return btVector3(V);
#else
		return btVector3(
			m_floats[1] * v.m_floats[2] - m_floats[2] * v.m_floats[1],
			m_floats[2] * v.m_floats[0] - m_floats[0] * v.m_floats[2],
			m_floats[0] * v.m_floats[1] - m_floats[1] * v.m_floats[0]);
#endif
	}